

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# face-table.c
# Opt level: O2

ndn_table_id_t ndn_facetab_register(ndn_face_table_t *self,ndn_face_intf_t *face)

{
  ulong uVar1;
  
  uVar1 = 0;
  do {
    if (self->capacity == uVar1) {
      uVar1 = 0xffff;
LAB_0011284f:
      return (ndn_table_id_t)uVar1;
    }
    if (self[uVar1 + 1] == (ndn_face_table_t)0x0) {
      self[uVar1 + 1] = (ndn_face_table_t)face;
      goto LAB_0011284f;
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

ndn_table_id_t ndn_facetab_register(ndn_face_table_t* self, ndn_face_intf_t* face){
  ndn_table_id_t i;
  for(i = 0; i < self->capacity; i ++){
    if(self->slots[i] == NULL){
      self->slots[i] = face;
      return i;
    }
  }
  return NDN_INVALID_ID;
}